

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O3

DdNode * Llb_ManComputeInitState(Llb_Man_t *p,DdManager *dd)

{
  abctime aVar1;
  DdNode *pDVar2;
  Aig_Man_t *pAVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  DdNode *f;
  
  aVar1 = dd->TimeStop;
  dd->TimeStop = 0;
  pDVar2 = Cudd_ReadOne(dd);
  Cudd_Ref(pDVar2);
  pAVar3 = p->pAig;
  if (0 < pAVar3->nRegs) {
    iVar5 = 0;
    f = pDVar2;
    do {
      uVar4 = pAVar3->nTruePis + iVar5;
      if (((int)uVar4 < 0) || (pAVar3->vCis->nSize <= (int)uVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar6 = iVar5;
      if (p->ddG != dd) {
        iVar6 = *(int *)((long)pAVar3->vCis->pArray[uVar4] + 0x24);
        if (((long)iVar6 < 0) || (p->vObj2Var->nSize <= iVar6)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = p->vObj2Var->pArray[iVar6];
      }
      pDVar2 = Cudd_bddIthVar(dd,iVar6);
      pDVar2 = Cudd_bddAnd(dd,f,(DdNode *)((ulong)pDVar2 ^ 1));
      Cudd_Ref(pDVar2);
      Cudd_RecursiveDeref(dd,f);
      iVar5 = iVar5 + 1;
      pAVar3 = p->pAig;
      f = pDVar2;
    } while (iVar5 < pAVar3->nRegs);
  }
  Cudd_Deref(pDVar2);
  dd->TimeStop = aVar1;
  return pDVar2;
}

Assistant:

DdNode * Llb_ManComputeInitState( Llb_Man_t * p, DdManager * dd )
{
    Aig_Obj_t * pObj;
    DdNode * bRes, * bVar, * bTemp;
    int i, iVar;
    abctime TimeStop;
    TimeStop = dd->TimeStop; dd->TimeStop = 0;
    bRes = Cudd_ReadOne( dd );   Cudd_Ref( bRes );
    Saig_ManForEachLo( p->pAig, pObj, i )
    {
        iVar  = (dd == p->ddG) ? i : Vec_IntEntry(p->vObj2Var, Aig_ObjId(pObj));
        bVar  = Cudd_bddIthVar( dd, iVar );
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, Cudd_Not(bVar) );  Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
    }
    Cudd_Deref( bRes );
    dd->TimeStop = TimeStop;
    return bRes;
}